

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QModelIndexList * __thiscall QAbstractItemView::selectedIndexes(QAbstractItemView *this)

{
  long lVar1;
  bool bVar2;
  QList<QModelIndex> *in_RSI;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QModelIndexList *indexes;
  anon_class_8_1_8991fb9c_for__M_pred isHidden;
  anon_class_8_1_8991fb9c_for__M_pred pred;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pred.this = in_RDI;
  d_func((QAbstractItemView *)0x80992b);
  *(Data **)&((pred.this)->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(QModelIndex **)&((pred.this)->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 =
       (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &((pred.this)->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x80995f);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x809970);
  if (bVar2) {
    QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x809987);
    QItemSelectionModel::selectedIndexes();
    QList<QModelIndex>::operator=(in_RSI,(QList<QModelIndex> *)in_RDI);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8099ad);
    QList<QModelIndex>::removeIf<QAbstractItemView::selectedIndexes()const::__0>(in_RSI,pred);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QModelIndexList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndexList QAbstractItemView::selectedIndexes() const
{
    Q_D(const QAbstractItemView);
    QModelIndexList indexes;
    if (d->selectionModel) {
        indexes = d->selectionModel->selectedIndexes();
        auto isHidden = [this](const QModelIndex &idx) {
            return isIndexHidden(idx);
        };
        indexes.removeIf(isHidden);
    }
    return indexes;
}